

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O1

PmError alsa_poll(PmInternal *midi)

{
  long lVar1;
  int iVar2;
  long lVar3;
  int i;
  long lVar4;
  snd_seq_event_t *ev;
  snd_seq_event_t *local_30;
  
  iVar2 = snd_seq_event_input_pending(seq,1);
  while (0 < iVar2) {
    while (iVar2 = snd_seq_event_input_pending(seq,0), 0 < iVar2) {
      iVar2 = snd_seq_event_input(seq);
      if (iVar2 < 0) {
        if ((iVar2 == -0x1c) && (0 < pm_descriptor_index)) {
          lVar3 = 0x30;
          lVar4 = 0;
          do {
            if ((*(int *)((long)descriptors + lVar3 + -0x18) != 0) &&
               (lVar1 = *(long *)((long)&(descriptors->pub).structVersion + lVar3), lVar1 != 0)) {
              Pm_SetOverflow(*(PmQueue **)(lVar1 + 0x20));
            }
            lVar4 = lVar4 + 1;
            lVar3 = lVar3 + 0x40;
          } while (lVar4 < pm_descriptor_index);
        }
      }
      else {
        handle_event(local_30);
      }
    }
    iVar2 = snd_seq_event_input_pending(seq,1);
  }
  return pmNoData;
}

Assistant:

static PmError alsa_poll(PmInternal *midi)
{
    snd_seq_event_t *ev;
    /* expensive check for input data, gets data from device: */
    while (snd_seq_event_input_pending(seq, TRUE) > 0) {
        /* cheap check on local input buffer */
        while (snd_seq_event_input_pending(seq, FALSE) > 0) {
            /* check for and ignore errors, e.g. input overflow */
            /* note: if there's overflow, this should be reported
             * all the way through to client. Since input from all
             * devices is merged, we need to find all input devices
             * and set all to the overflow state.
             * NOTE: this assumes every input is ALSA based.
             */
            int rslt = snd_seq_event_input(seq, &ev);
            if (rslt >= 0) {
                handle_event(ev);
            } else if (rslt == -ENOSPC) {
                int i;
                for (i = 0; i < pm_descriptor_index; i++) {
                    if (descriptors[i].pub.input) {
                        PmInternal *midi = (PmInternal *) 
                                descriptors[i].internalDescriptor;
                        /* careful, device may not be open! */
                        if (midi) Pm_SetOverflow(midi->queue);
                    }
                }
            }
        }
    }
    return pmNoError;
}